

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImTextCountCharsFromUtf8(char *in_text,char *in_text_end)

{
  int iVar1;
  bool bVar2;
  uint local_20;
  int local_1c;
  uint c;
  int char_count;
  char *in_text_end_local;
  char *in_text_local;
  
  local_1c = 0;
  _c = in_text_end;
  in_text_end_local = in_text;
  while( true ) {
    if ((_c == (char *)0x0) || (bVar2 = false, in_text_end_local < _c)) {
      bVar2 = *in_text_end_local != '\0';
    }
    if (!bVar2) break;
    iVar1 = ImTextCharFromUtf8(&local_20,in_text_end_local,_c);
    in_text_end_local = in_text_end_local + iVar1;
    if (local_20 == 0) {
      return local_1c;
    }
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

int ImTextCountCharsFromUtf8(const char* in_text, const char* in_text_end)
{
    int char_count = 0;
    while ((!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c;
        in_text += ImTextCharFromUtf8(&c, in_text, in_text_end);
        if (c == 0)
            break;
        char_count++;
    }
    return char_count;
}